

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O3

void * parseElement(SymbolContext<char> *ctx)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer ppVar3;
  int iVar4;
  XMLElement *this;
  pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  pointer ppVar5;
  string n;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  this = (XMLElement *)operator_new(0x88);
  XMLElement::XMLElement(this,ctx);
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (this->m_name)._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar4 == 0) {
    ppVar3 = (this->m_body).m_elements.
             super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (this->m_body).m_elements.
                  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1)
    {
      iVar4 = std::__cxx11::string::compare((char *)ppVar5);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)&(ppVar5->first).m_body);
        if (iVar4 == 0) goto LAB_0010f1ae;
        break;
      }
    }
    std::
    vector<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&(this->m_body).m_elements);
    pcVar2 = (this->m_body).m_content._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this->m_body).m_content.field_2) {
      operator_delete(pcVar2);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(this->m_attributes)._M_t);
    pcVar2 = (this->m_name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this->m_name).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(this);
    this = (XMLElement *)operator_new(0x88);
    (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)this,local_48,local_48 + local_40);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_48);
    if ((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_48), iVar4 != 0)) &&
        (iVar4 = std::__cxx11::string::compare((char *)&local_48), iVar4 != 0)) &&
       (((iVar4 = std::__cxx11::string::compare((char *)&local_48), iVar4 != 0 &&
         (iVar4 = std::__cxx11::string::compare((char *)&local_48), iVar4 != 0)) &&
        ((iVar4 = std::__cxx11::string::compare((char *)&local_48), iVar4 != 0 &&
         (iVar4 = std::__cxx11::string::compare((char *)&local_48), iVar4 != 0))))))
    goto LAB_0010f1ae;
    std::
    vector<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&(this->m_body).m_elements);
    pcVar2 = (this->m_body).m_content._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this->m_body).m_content.field_2) {
      operator_delete(pcVar2);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(this->m_attributes)._M_t);
    pcVar2 = (this->m_name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this->m_name).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(this);
    this = (XMLElement *)operator_new(0x88);
    (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)this,local_48,local_48 + local_40);
  }
  p_Var1 = &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_body).m_content._M_dataplus._M_p = (pointer)&(this->m_body).m_content.field_2;
  (this->m_body).m_content._M_string_length = 0;
  (this->m_body).m_content.field_2._M_local_buf[0] = '\0';
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0010f1ae:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return this;
}

Assistant:

void *parseElement(const SymbolContext<char>& ctx)
{
    XMLElement *elem = new XMLElement(ctx);

    std::string n = elem->get_name();
    if (n == "article")
    {
        const XMLElement *year = elem->get_element("year");
        if (year != nullptr && year->get_content() == "1990")
        {
          // count++
        }
        else
        {
            delete elem;
            return new XMLElement(n);
        }
    }
    else if (n == "inproceedings" || n == "proceedings" || n == "book" || n == "incollection" || n == "phdthesis" || n == "mastersthesis" || n == "www")
    {
        delete elem;
        return new XMLElement(n);
    }
    return elem;
}